

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

BinaryExpr<const_frozen::basic_string<char>_&,_const_std::basic_string_view<char,_std::char_traits<char>_>_&>
* __thiscall
Catch::ExprLhs<frozen::basic_string<char>const&>::operator==
          (BinaryExpr<const_frozen::basic_string<char>_&,_const_std::basic_string_view<char,_std::char_traits<char>_>_&>
           *__return_storage_ptr__,ExprLhs<frozen::basic_string<char>const&> *this,
          basic_string_view<char,_std::char_traits<char>_> *rhs)

{
  basic_string<char> *lhs;
  bool comparisonResult;
  StringRef local_30;
  basic_string_view<char,_std::char_traits<char>_> *local_20;
  basic_string_view<char,_std::char_traits<char>_> *rhs_local;
  ExprLhs<const_frozen::basic_string<char>_&> *this_local;
  
  local_20 = rhs;
  rhs_local = (basic_string_view<char,_std::char_traits<char>_> *)this;
  this_local = (ExprLhs<const_frozen::basic_string<char>_&> *)__return_storage_ptr__;
  comparisonResult =
       compareEqual<frozen::basic_string<char>,std::basic_string_view<char,std::char_traits<char>>>
                 (*(basic_string<char> **)this,rhs);
  lhs = *(basic_string<char> **)this;
  StringRef::StringRef(&local_30,"==");
  BinaryExpr<const_frozen::basic_string<char>_&,_const_std::basic_string_view<char,_std::char_traits<char>_>_&>
  ::BinaryExpr(__return_storage_ptr__,comparisonResult,lhs,local_30,local_20);
  return __return_storage_ptr__;
}

Assistant:

auto operator == ( RhsT const& rhs ) -> BinaryExpr<LhsT, RhsT const&> const {
            return { compareEqual( m_lhs, rhs ), m_lhs, "==", rhs };
        }